

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O0

int __thiscall FastPForLib::ZipfianGenerator::nextInt(ZipfianGenerator *this)

{
  iterator __lhs;
  difference_type dVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  double u;
  double *in_stack_ffffffffffffffe8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  
  __first._M_current = (double *)in_RDI;
  __last._M_current = (double *)ZRandom::getDouble((ZRandom *)0x10a3fb);
  std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  std::
  lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (__first,__last,in_stack_ffffffffffffffe8);
  __lhs = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     __lhs._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_RDI);
  return (int)dVar1;
}

Assistant:

int nextInt() {
    // Map z to the value
    const double u = rand.getDouble();
    return static_cast<int>(lower_bound(proba.begin(), proba.end(), u) -
                            proba.begin());
  }